

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

bool nullcInitVectorModule(void)

{
  nullres nVar1;
  bool bVar2;
  
  bVar2 = false;
  nVar1 = nullcBindModuleFunctionHelper<void,NULLCVector::vector*,unsigned_int,int>
                    ("old.vector",NULLCVector::ConstructVector,"cConstructVector",0);
  if (nVar1 != '\0') {
    bVar2 = false;
    nVar1 = nullcBindModuleFunctionHelper<void,NULLCRef,NULLCVector::vector*>
                      ("old.vector",NULLCVector::VectorPushBack,"vector::push_back",0);
    if (nVar1 != '\0') {
      bVar2 = false;
      nVar1 = nullcBindModuleFunctionHelper<void,NULLCVector::vector*>
                        ("old.vector",NULLCVector::VectorPopBack,"vector::pop_back",0);
      if (nVar1 != '\0') {
        bVar2 = false;
        nVar1 = nullcBindModuleFunctionHelper<NULLCRef,NULLCVector::vector*>
                          ("old.vector",NULLCVector::VectorFront,"vector::front",0);
        if (nVar1 != '\0') {
          bVar2 = false;
          nVar1 = nullcBindModuleFunctionHelper<NULLCRef,NULLCVector::vector*>
                            ("old.vector",NULLCVector::VectorBack,"vector::back",0);
          if (nVar1 != '\0') {
            bVar2 = false;
            nVar1 = nullcBindModuleFunctionHelper<NULLCRef,NULLCVector::vector*,unsigned_int>
                              ("old.vector",NULLCVector::VectorIndex,"[]",0);
            if (nVar1 != '\0') {
              bVar2 = false;
              nVar1 = nullcBindModuleFunctionHelper<void,unsigned_int,NULLCVector::vector*>
                                ("old.vector",NULLCVector::VectorReserve,"vector::reserve",0);
              if (nVar1 != '\0') {
                bVar2 = false;
                nVar1 = nullcBindModuleFunctionHelper<void,unsigned_int,NULLCVector::vector*>
                                  ("old.vector",NULLCVector::VectorResize,"vector::resize",0);
                if (nVar1 != '\0') {
                  bVar2 = false;
                  nVar1 = nullcBindModuleFunctionHelper<void,NULLCVector::vector*>
                                    ("old.vector",NULLCVector::VectorClear,"vector::clear",0);
                  if (nVar1 != '\0') {
                    bVar2 = false;
                    nVar1 = nullcBindModuleFunctionHelper<void,NULLCVector::vector*>
                                      ("old.vector",NULLCVector::VectorDestroy,"vector::destroy",0);
                    if (nVar1 != '\0') {
                      bVar2 = false;
                      nVar1 = nullcBindModuleFunctionHelper<int,NULLCVector::vector*>
                                        ("old.vector",NULLCVector::VectorSize,"vector::size",0);
                      if (nVar1 != '\0') {
                        bVar2 = false;
                        nVar1 = nullcBindModuleFunctionHelper<int,NULLCVector::vector*>
                                          ("old.vector",NULLCVector::VectorCapacity,
                                           "vector::capacity",0);
                        if (nVar1 != '\0') {
                          bVar2 = false;
                          nVar1 = nullcBindModuleFunctionHelper<NULLCRef,NULLCVector::vector_iterator*>
                                            ("old.vector",NULLCVector::VectorNext,
                                             "vector_iterator::next",0);
                          if (nVar1 != '\0') {
                            nVar1 = nullcBindModuleFunctionHelper<int,NULLCVector::vector_iterator*>
                                              ("old.vector",NULLCVector::VectorHasNext,
                                               "vector_iterator::hasnext",0);
                            bVar2 = nVar1 != '\0';
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool	nullcInitVectorModule()
{
	REGISTER_FUNC(ConstructVector, "cConstructVector", 0);

	REGISTER_FUNC(VectorPushBack, "vector::push_back", 0);
	REGISTER_FUNC(VectorPopBack, "vector::pop_back", 0);
	REGISTER_FUNC(VectorFront, "vector::front", 0);
	REGISTER_FUNC(VectorBack, "vector::back", 0);
	REGISTER_FUNC(VectorIndex, "[]", 0);
	REGISTER_FUNC(VectorReserve, "vector::reserve", 0);
	REGISTER_FUNC(VectorResize, "vector::resize", 0);
	REGISTER_FUNC(VectorClear, "vector::clear", 0);
	REGISTER_FUNC(VectorDestroy, "vector::destroy", 0);
	REGISTER_FUNC(VectorSize, "vector::size", 0);
	REGISTER_FUNC(VectorCapacity, "vector::capacity", 0);

	REGISTER_FUNC(VectorNext, "vector_iterator::next", 0);
	REGISTER_FUNC(VectorHasNext, "vector_iterator::hasnext", 0);

	return true;
}